

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.h
# Opt level: O0

void __thiscall
VW::object_pool<obj,_obj_initializer>::new_chunk
          (object_pool<obj,_obj_initializer> *this,size_t size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  type poVar3;
  ulong in_RSI;
  long in_RDI;
  size_t i;
  value_type *chunk;
  value_type *in_stack_ffffffffffffff68;
  obj_initializer *in_stack_ffffffffffffff70;
  unique_ptr<obj[],_std::default_delete<obj[]>_> *in_stack_ffffffffffffff80;
  ulong local_58;
  type local_50;
  type local_48;
  pair<obj_*,_obj_*> local_40;
  reference local_30;
  ulong local_10;
  
  if (in_RSI != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_RSI;
    uVar2 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    local_10 = in_RSI;
    operator_new__(uVar2);
    std::unique_ptr<obj[],std::default_delete<obj[]>>::
    unique_ptr<obj*,std::default_delete<obj[]>,void,bool>
              ((unique_ptr<obj[],_std::default_delete<obj[]>_> *)in_stack_ffffffffffffff70,
               (obj *)in_stack_ffffffffffffff68);
    std::
    vector<std::unique_ptr<obj[],_std::default_delete<obj[]>_>,_std::allocator<std::unique_ptr<obj[],_std::default_delete<obj[]>_>_>_>
    ::push_back((vector<std::unique_ptr<obj[],_std::default_delete<obj[]>_>,_std::allocator<std::unique_ptr<obj[],_std::default_delete<obj[]>_>_>_>
                 *)in_stack_ffffffffffffff70,(value_type *)in_stack_ffffffffffffff68);
    std::unique_ptr<obj[],_std::default_delete<obj[]>_>::~unique_ptr(in_stack_ffffffffffffff80);
    local_30 = std::
               vector<std::unique_ptr<obj[],_std::default_delete<obj[]>_>,_std::allocator<std::unique_ptr<obj[],_std::default_delete<obj[]>_>_>_>
               ::back((vector<std::unique_ptr<obj[],_std::default_delete<obj[]>_>,_std::allocator<std::unique_ptr<obj[],_std::default_delete<obj[]>_>_>_>
                       *)in_stack_ffffffffffffff70);
    local_48 = std::unique_ptr<obj[],_std::default_delete<obj[]>_>::operator[]
                         ((unique_ptr<obj[],_std::default_delete<obj[]>_> *)
                          in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
    local_50 = std::unique_ptr<obj[],_std::default_delete<obj[]>_>::operator[]
                         ((unique_ptr<obj[],_std::default_delete<obj[]>_> *)
                          in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
    std::pair<obj_*,_obj_*>::pair<obj_*,_obj_*,_true>(&local_40,&local_48,&local_50);
    std::vector<std::pair<obj_*,_obj_*>,_std::allocator<std::pair<obj_*,_obj_*>_>_>::push_back
              ((vector<std::pair<obj_*,_obj_*>,_std::allocator<std::pair<obj_*,_obj_*>_>_> *)
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    for (local_58 = 0; local_58 < local_10; local_58 = local_58 + 1) {
      poVar3 = std::unique_ptr<obj[],_std::default_delete<obj[]>_>::operator[]
                         ((unique_ptr<obj[],_std::default_delete<obj[]>_> *)
                          in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
      memset(poVar3,0,4);
      poVar3 = std::unique_ptr<obj[],_std::default_delete<obj[]>_>::operator[]
                         ((unique_ptr<obj[],_std::default_delete<obj[]>_> *)
                          in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
      poVar3->i = 0;
      in_stack_ffffffffffffff70 = (obj_initializer *)(in_RDI + 0xa8);
      poVar3 = std::unique_ptr<obj[],_std::default_delete<obj[]>_>::operator[]
                         ((unique_ptr<obj[],_std::default_delete<obj[]>_> *)
                          in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
      obj_initializer::operator()(in_stack_ffffffffffffff70,poVar3);
      std::queue<obj_*,_std::deque<obj_*,_std::allocator<obj_*>_>_>::push
                ((queue<obj_*,_std::deque<obj_*,_std::allocator<obj_*>_>_> *)
                 in_stack_ffffffffffffff70,&in_stack_ffffffffffffff68->first);
    }
  }
  return;
}

Assistant:

void new_chunk(size_t size)
  {
    if(size == 0)
    {
      return;
    }

    m_chunks.push_back(std::unique_ptr<T[]>(new T[size]));
    auto& chunk = m_chunks.back();
    m_chunk_bounds.push_back({&chunk[0], &chunk[size - 1]});

    for (size_t i = 0; i < size; i++)
    {
      memset(&chunk[i], 0, sizeof(T));
      new (&chunk[i]) T{};
      m_pool.push(m_initializer(&chunk[i]));
    }
  }